

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O2

void __thiscall xray_re::xr_mesh_vbuf::reserve(xr_mesh_vbuf *this,size_t reserved)

{
  uint uVar1;
  
  if ((this->super_xr_vbuf).super_xr_flexbuf.m_size < reserved) {
    uVar1 = (this->super_xr_vbuf).m_signature;
    if ((uVar1 & 1) != 0) {
      extend<xray_re::_vector3<float>>(this,&(this->super_xr_vbuf).m_points,reserved);
      uVar1 = (this->super_xr_vbuf).m_signature;
    }
    if ((uVar1 & 2) != 0) {
      extend<xray_re::_vector3<float>>(this,&(this->super_xr_vbuf).m_normals,reserved);
      uVar1 = (this->super_xr_vbuf).m_signature;
    }
    if ((uVar1 & 4) != 0) {
      extend<xray_re::_vector2<float>>(this,&(this->super_xr_vbuf).m_texcoords,reserved);
      uVar1 = (this->super_xr_vbuf).m_signature;
    }
    if ((uVar1 & 0x10) != 0) {
      extend<xray_re::_influence<unsigned_int,float>>
                (this,&(this->super_xr_vbuf).m_influences,reserved);
      uVar1 = (this->super_xr_vbuf).m_signature;
    }
    if ((uVar1 & 0x20) != 0) {
      extend<xray_re::_color<float>>(this,&(this->super_xr_vbuf).m_colors,reserved);
    }
    this->m_reserved = reserved;
  }
  return;
}

Assistant:

void xr_mesh_vbuf::reserve(size_t reserved)
{
	if (reserved <= size())
		return;
	if (has_points())
		extend(m_points, reserved);
	if (has_normals())
		extend(m_normals, reserved);
	if (has_texcoords())
		extend(m_texcoords, reserved);
	if (has_influences())
		extend(m_influences, reserved);
	if (has_colors())
		extend(m_colors, reserved);
	m_reserved = reserved;
}